

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefiledeps.cpp
# Opt level: O3

void __thiscall
QMakeSourceFileInfo::addSourceFile
          (QMakeSourceFileInfo *this,QString *f,uchar seek,SourceFileType type)

{
  undefined1 auVar1 [16];
  SourceFiles *this_00;
  SourceFileNode **ppSVar2;
  SourceFile *p;
  long lVar3;
  char *file;
  long in_FS_OFFSET;
  undefined1 auVar4 [16];
  QMakeLocalFileName local_80;
  QArrayData *local_50;
  char *local_48;
  long local_38;
  long lVar5;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->files;
  if (this_00 == (SourceFiles *)0x0) {
    this_00 = (SourceFiles *)operator_new(0x10);
    this_00->num_nodes = 0xbdd;
    ppSVar2 = (SourceFileNode **)malloc(0x5ee8);
    this_00->nodes = ppSVar2;
    auVar1 = _DAT_002aa0a0;
    lVar3 = 1;
    auVar4 = _DAT_002aa090;
    do {
      if (SUB164(auVar4 ^ auVar1,4) == -0x80000000 && SUB164(auVar4 ^ auVar1,0) < -0x7ffff423) {
        ppSVar2[lVar3 + -1] = (SourceFileNode *)0x0;
        ppSVar2[lVar3] = (SourceFileNode *)0x0;
      }
      lVar5 = auVar4._8_8_;
      auVar4._0_8_ = auVar4._0_8_ + 2;
      auVar4._8_8_ = lVar5 + 2;
      lVar3 = lVar3 + 2;
    } while (lVar3 != 0xbdf);
    this->files = this_00;
  }
  local_80.real_name.d.d = (f->d).d;
  local_80.real_name.d.ptr = (f->d).ptr;
  local_80.real_name.d.size = (f->d).size;
  if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((local_80.real_name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((local_80.real_name.d.d)->super_QArrayData).ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    this_00 = this->files;
  }
  local_80.local_name.d.d = (Data *)0x0;
  local_80.local_name.d.ptr = (char16_t *)0x0;
  local_80.local_name.d.size = 0;
  QMakeLocalFileName::local(&local_80);
  QString::toLatin1_helper((QString *)&local_50);
  file = local_48;
  if (local_48 == (char *)0x0) {
    file = (char *)&QByteArray::_empty;
  }
  p = SourceFiles::lookupFile(this_00,file);
  if (local_50 != (QArrayData *)0x0) {
    LOCK();
    (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_50,1,0x10);
    }
  }
  if (p == (SourceFile *)0x0) {
    p = (SourceFile *)operator_new(0x40);
    (p->file).real_name.d.d = (Data *)0x0;
    (p->file).real_name.d.ptr = (char16_t *)0x0;
    (p->file).real_name.d.size = 0;
    (p->file).local_name.d.d = (Data *)0x0;
    (p->file).local_name.d.ptr = (char16_t *)0x0;
    (p->file).local_name.d.size = 0;
    *(undefined8 *)((long)&(p->file).local_name.d.size + 4) = 0;
    *(undefined8 *)((long)&p->deps + 4) = 0;
    *(undefined2 *)&p->field_0x3c = 4;
    QString::operator=((QString *)p,(QString *)&local_80);
    QString::operator=(&(p->file).local_name,(QString *)&local_80.local_name);
    SourceFiles::addFile(this->files,p,(char *)0x0,true);
LAB_0019469b:
    if (type == TYPE_UNKNOWN) goto LAB_001946a5;
  }
  else {
    if (((p->type == type) || (type == TYPE_UNKNOWN)) || (p->type == TYPE_UNKNOWN))
    goto LAB_0019469b;
    QString::toLatin1_helper((QString *)&local_50);
    if (local_48 == (char *)0x0) {
      local_48 = (char *)&QByteArray::_empty;
    }
    warn_msg(WarnLogic,"%s is marked as %d, then %d!",local_48,(ulong)p->type,(ulong)type);
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,1,0x10);
      }
    }
  }
  p->type = type;
LAB_001946a5:
  if (((seek & 2) != 0) && ((p->field_0x3c & 8) == 0)) {
    findMocs(this,p);
  }
  if (((seek & 1) != 0) && ((p->field_0x3c & 0x10) == 0)) {
    findDeps(this,p);
  }
  if (&(local_80.local_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_80.local_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_80.local_name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_80.real_name.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_80.real_name.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(local_80.real_name.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMakeSourceFileInfo::addSourceFile(const QString &f, uchar seek,
                                        QMakeSourceFileInfo::SourceFileType type)
{
    if(!files)
        files = new SourceFiles;

    QMakeLocalFileName fn(f);
    SourceFile *file = files->lookupFile(fn);
    if(!file) {
        file = new SourceFile;
        file->file = fn;
        files->addFile(file);
    } else {
        if(file->type != type && file->type != TYPE_UNKNOWN && type != TYPE_UNKNOWN)
            warn_msg(WarnLogic, "%s is marked as %d, then %d!", f.toLatin1().constData(),
                     file->type, type);
    }
    if(type != TYPE_UNKNOWN)
        file->type = type;

    if(seek & SEEK_MOCS && !file->moc_checked)
        findMocs(file);
    if(seek & SEEK_DEPS && !file->dep_checked)
        findDeps(file);
}